

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::setEnvironment(Triple *this,EnvironmentType Kind)

{
  ObjectFormatType OVar1;
  ObjectFormatType OVar2;
  StringRef Str;
  StringRef local_e0;
  StringRef local_d0;
  Twine local_c0;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  StringRef local_48;
  
  OVar1 = this->ObjectFormat;
  OVar2 = getDefaultFormat(this);
  if (OVar1 == OVar2) {
    Str = getEnvironmentTypeName(Kind);
    setEnvironmentName(this,Str);
    return;
  }
  local_d0 = getEnvironmentTypeName(Kind);
  Twine::Twine(&local_90,&local_d0);
  Twine::Twine(&local_a8,"-");
  Twine::concat(&local_78,&local_90,&local_a8);
  local_e0 = getObjectFormatTypeName(this->ObjectFormat);
  Twine::Twine(&local_c0,&local_e0);
  Twine::concat(&local_60,&local_78,&local_c0);
  Twine::str_abi_cxx11_((string *)&local_48,&local_60);
  setEnvironmentName(this,local_48);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Triple::setEnvironment(EnvironmentType Kind) {
  if (ObjectFormat == getDefaultFormat(*this))
    return setEnvironmentName(getEnvironmentTypeName(Kind));

  setEnvironmentName((getEnvironmentTypeName(Kind) + Twine("-") +
                      getObjectFormatTypeName(ObjectFormat)).str());
}